

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  BVH *bvh;
  size_t sVar2;
  Scene *pSVar3;
  float *pfVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  byte bVar17;
  bool bVar18;
  int iVar19;
  float *vertices;
  long lVar20;
  NodeRef *pNVar21;
  size_t sVar22;
  ulong uVar23;
  size_t sVar24;
  long lVar25;
  uint uVar26;
  NodeRef root;
  long lVar27;
  byte bVar28;
  byte bVar29;
  undefined4 uVar30;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar85 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  uint local_1a04;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined1 local_1988 [16];
  RayK<4> *local_1978;
  undefined4 local_196c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1968;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1908;
  undefined1 local_18d8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_18c8;
  undefined1 local_18b8 [16];
  undefined1 local_18a8 [16];
  uint local_1898;
  uint uStack_1894;
  uint uStack_1890;
  uint uStack_188c;
  uint uStack_1888;
  uint uStack_1884;
  uint uStack_1880;
  uint uStack_187c;
  TravRayK<4,_true> tray;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar33 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar37 = ZEXT816(0) << 0x40;
    uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar37,5);
    uVar32 = vpcmpeqd_avx512vl(auVar33,(undefined1  [16])valid_i->field_0);
    uVar32 = ((byte)uVar9 & 0xf) & uVar32;
    bVar17 = (byte)uVar32;
    if (bVar17 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar92 = ZEXT1664(auVar33);
      auVar34 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar33);
      auVar58._8_4_ = 0x219392ef;
      auVar58._0_8_ = 0x219392ef219392ef;
      auVar58._12_4_ = 0x219392ef;
      uVar23 = vcmpps_avx512vl(auVar34,auVar58,1);
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar93 = ZEXT1664(auVar34);
      auVar35 = vdivps_avx512vl(auVar34,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar36 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar33);
      uVar10 = vcmpps_avx512vl(auVar36,auVar58,1);
      auVar36 = vdivps_avx512vl(auVar34,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar33 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar33);
      uVar11 = vcmpps_avx512vl(auVar33,auVar58,1);
      auVar33 = vdivps_avx512vl(auVar34,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar18 = (bool)((byte)uVar23 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar35._0_4_;
      bVar18 = (bool)((byte)(uVar23 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar35._4_4_;
      bVar18 = (bool)((byte)(uVar23 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar35._8_4_;
      bVar18 = (bool)((byte)(uVar23 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar35._12_4_;
      bVar18 = (bool)((byte)uVar10 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar36._0_4_;
      bVar18 = (bool)((byte)(uVar10 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar36._4_4_;
      bVar18 = (bool)((byte)(uVar10 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar36._8_4_;
      bVar18 = (bool)((byte)(uVar10 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar36._12_4_;
      bVar18 = (bool)((byte)uVar11 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar33._0_4_;
      bVar18 = (bool)((byte)(uVar11 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar33._4_4_;
      bVar18 = (bool)((byte)(uVar11 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar33._8_4_;
      bVar18 = (bool)((byte)(uVar11 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar18 * 0x5d5e0b6b | (uint)!bVar18 * auVar33._12_4_;
      uVar23 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar37,1);
      auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar23 & 1) * auVar33._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * auVar33._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * auVar33._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar23 >> 3) & 1) * auVar33._12_4_;
      local_196c = (undefined4)uVar32;
      uVar23 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar37,5);
      auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar18 = (bool)((byte)uVar23 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar18 * auVar33._0_4_ | (uint)!bVar18 * 0x30;
      bVar18 = (bool)((byte)(uVar23 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar18 * auVar33._4_4_ | (uint)!bVar18 * 0x30;
      bVar18 = (bool)((byte)(uVar23 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar18 * auVar33._8_4_ | (uint)!bVar18 * 0x30;
      bVar18 = (bool)((byte)(uVar23 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar18 * auVar33._12_4_ | (uint)!bVar18 * 0x30;
      uVar23 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar37,5);
      auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar18 = (bool)((byte)uVar23 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar18 * auVar33._0_4_ | (uint)!bVar18 * 0x50;
      bVar18 = (bool)((byte)(uVar23 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar18 * auVar33._4_4_ | (uint)!bVar18 * 0x50;
      bVar18 = (bool)((byte)(uVar23 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar18 * auVar33._8_4_ | (uint)!bVar18 * 0x50;
      bVar18 = (bool)((byte)(uVar23 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar18 * auVar33._12_4_ | (uint)!bVar18 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar94 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar33 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar37);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar17 & 1) * auVar33._0_4_ |
           (uint)!(bool)(bVar17 & 1) * stack_near[0].field_0._0_4_;
      bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar18 * auVar33._4_4_ | (uint)!bVar18 * stack_near[0].field_0._4_4_;
      bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar18 * auVar33._8_4_ | (uint)!bVar18 * stack_near[0].field_0._8_4_;
      bVar18 = SUB81(uVar32 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar18 * auVar33._12_4_ | (uint)!bVar18 * stack_near[0].field_0._12_4_;
      auVar33 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar37);
      tray.tfar.field_0.i[0] =
           (uint)(bVar17 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar17 & 1) * -0x800000;
      bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar18 * auVar33._4_4_ | (uint)!bVar18 * -0x800000;
      bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar18 * auVar33._8_4_ | (uint)!bVar18 * -0x800000;
      bVar18 = SUB81(uVar32 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar18 * auVar33._12_4_ | (uint)!bVar18 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar26 = 3;
      }
      else {
        uVar26 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1978 = ray + 0x80;
      local_1a04 = (ushort)uVar32 ^ 0xf;
      pNVar21 = stack_node + 2;
      paVar31 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar95 = ZEXT1664(auVar33);
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar96 = ZEXT1664(auVar33);
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar97 = ZEXT1664(auVar33);
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar91 = ZEXT1664(auVar33);
LAB_01c969ac:
      do {
        do {
          root.ptr = pNVar21[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01c97cba;
          pNVar21 = pNVar21 + -1;
          aVar72 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar31[-1].v;
          auVar85 = ZEXT1664((undefined1  [16])aVar72);
          paVar31 = paVar31 + -1;
          uVar32 = vcmpps_avx512vl((undefined1  [16])aVar72,(undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar32 == '\0');
        uVar30 = (undefined4)uVar32;
        if (uVar26 < (uint)POPCOUNT(uVar30)) {
LAB_01c969f4:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01c97cba;
              uVar9 = vcmpps_avx512vl(auVar85._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar9 == '\0') goto LAB_01c969ac;
              bVar17 = ~(byte)local_1a04 & 0xf;
              lVar27 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              lVar20 = 0;
              goto LAB_01c96bcd;
            }
            sVar24 = 8;
            aVar72 = auVar94._0_16_;
            for (lVar20 = 0;
                (auVar85 = ZEXT1664((undefined1  [16])aVar72), lVar20 != 4 &&
                (sVar2 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar20 * 8), sVar2 != 8));
                lVar20 = lVar20 + 1) {
              uVar30 = *(undefined4 *)(root.ptr + 0x20 + lVar20 * 4);
              auVar66._4_4_ = uVar30;
              auVar66._0_4_ = uVar30;
              auVar66._8_4_ = uVar30;
              auVar66._12_4_ = uVar30;
              auVar14._8_8_ = tray.org.field_0._8_8_;
              auVar14._0_8_ = tray.org.field_0._0_8_;
              auVar15._8_8_ = tray.org.field_0._24_8_;
              auVar15._0_8_ = tray.org.field_0._16_8_;
              auVar16._8_8_ = tray.org.field_0._40_8_;
              auVar16._0_8_ = tray.org.field_0._32_8_;
              auVar33 = vsubps_avx(auVar66,auVar14);
              auVar81._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar33._0_4_;
              auVar81._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar33._4_4_;
              auVar81._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar33._8_4_;
              auVar81._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar33._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x40 + lVar20 * 4);
              auVar67._4_4_ = uVar30;
              auVar67._0_4_ = uVar30;
              auVar67._8_4_ = uVar30;
              auVar67._12_4_ = uVar30;
              auVar33 = vsubps_avx(auVar67,auVar15);
              auVar82._0_4_ = tray.rdir.field_0._16_4_ * auVar33._0_4_;
              auVar82._4_4_ = tray.rdir.field_0._20_4_ * auVar33._4_4_;
              auVar82._8_4_ = tray.rdir.field_0._24_4_ * auVar33._8_4_;
              auVar82._12_4_ = tray.rdir.field_0._28_4_ * auVar33._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x60 + lVar20 * 4);
              auVar68._4_4_ = uVar30;
              auVar68._0_4_ = uVar30;
              auVar68._8_4_ = uVar30;
              auVar68._12_4_ = uVar30;
              auVar33 = vsubps_avx(auVar68,auVar16);
              auVar83._0_4_ = tray.rdir.field_0._32_4_ * auVar33._0_4_;
              auVar83._4_4_ = tray.rdir.field_0._36_4_ * auVar33._4_4_;
              auVar83._8_4_ = tray.rdir.field_0._40_4_ * auVar33._8_4_;
              auVar83._12_4_ = tray.rdir.field_0._44_4_ * auVar33._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x30 + lVar20 * 4);
              auVar69._4_4_ = uVar30;
              auVar69._0_4_ = uVar30;
              auVar69._8_4_ = uVar30;
              auVar69._12_4_ = uVar30;
              auVar33 = vsubps_avx(auVar69,auVar14);
              auVar73._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar33._0_4_;
              auVar73._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar33._4_4_;
              auVar73._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar33._8_4_;
              auVar73._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar33._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x50 + lVar20 * 4);
              auVar70._4_4_ = uVar30;
              auVar70._0_4_ = uVar30;
              auVar70._8_4_ = uVar30;
              auVar70._12_4_ = uVar30;
              auVar33 = vsubps_avx(auVar70,auVar15);
              auVar74._0_4_ = tray.rdir.field_0._16_4_ * auVar33._0_4_;
              auVar74._4_4_ = tray.rdir.field_0._20_4_ * auVar33._4_4_;
              auVar74._8_4_ = tray.rdir.field_0._24_4_ * auVar33._8_4_;
              auVar74._12_4_ = tray.rdir.field_0._28_4_ * auVar33._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x70 + lVar20 * 4);
              auVar71._4_4_ = uVar30;
              auVar71._0_4_ = uVar30;
              auVar71._8_4_ = uVar30;
              auVar71._12_4_ = uVar30;
              auVar33 = vsubps_avx(auVar71,auVar16);
              auVar76._0_4_ = tray.rdir.field_0._32_4_ * auVar33._0_4_;
              auVar76._4_4_ = tray.rdir.field_0._36_4_ * auVar33._4_4_;
              auVar76._8_4_ = tray.rdir.field_0._40_4_ * auVar33._8_4_;
              auVar76._12_4_ = tray.rdir.field_0._44_4_ * auVar33._12_4_;
              auVar33 = vminps_avx(auVar81,auVar73);
              auVar37 = vminps_avx(auVar82,auVar74);
              auVar33 = vmaxps_avx(auVar33,auVar37);
              auVar37 = vminps_avx(auVar83,auVar76);
              auVar33 = vmaxps_avx(auVar33,auVar37);
              auVar34 = vmulps_avx512vl(auVar33,auVar95._0_16_);
              auVar33 = vmaxps_avx(auVar81,auVar73);
              auVar37 = vmaxps_avx(auVar82,auVar74);
              auVar37 = vminps_avx(auVar33,auVar37);
              auVar33 = vmaxps_avx(auVar83,auVar76);
              auVar33 = vminps_avx(auVar37,auVar33);
              auVar37 = vmulps_avx512vl(auVar33,auVar96._0_16_);
              auVar33 = vmaxps_avx(auVar34,(undefined1  [16])tray.tnear.field_0);
              auVar37 = vminps_avx(auVar37,(undefined1  [16])tray.tfar.field_0);
              uVar32 = vcmpps_avx512vl(auVar33,auVar37,2);
              sVar22 = sVar24;
              aVar38 = aVar72;
              if ((byte)uVar32 != 0) {
                auVar33 = vblendmps_avx512vl((undefined1  [16])auVar94._0_16_,auVar34);
                bVar18 = (bool)((byte)uVar32 & 1);
                aVar38._0_4_ = (uint)bVar18 * auVar33._0_4_ | (uint)!bVar18 * auVar34._0_4_;
                bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
                aVar38._4_4_ = (uint)bVar18 * auVar33._4_4_ | (uint)!bVar18 * auVar34._4_4_;
                bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
                aVar38._8_4_ = (uint)bVar18 * auVar33._8_4_ | (uint)!bVar18 * auVar34._8_4_;
                bVar18 = (bool)((byte)(uVar32 >> 3) & 1);
                aVar38._12_4_ = (uint)bVar18 * auVar33._12_4_ | (uint)!bVar18 * auVar34._12_4_;
                sVar22 = sVar2;
                if (sVar24 != 8) {
                  pNVar21->ptr = sVar24;
                  pNVar21 = pNVar21 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar31->v = aVar72;
                  paVar31 = paVar31 + 1;
                }
              }
              aVar72 = aVar38;
              sVar24 = sVar22;
            }
            if (sVar24 == 8) goto LAB_01c96b74;
            uVar9 = vcmpps_avx512vl((undefined1  [16])aVar72,(undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar24;
          } while ((byte)uVar26 < (byte)POPCOUNT((int)uVar9));
          pNVar21->ptr = sVar24;
          pNVar21 = pNVar21 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar31->v = aVar72;
          paVar31 = paVar31 + 1;
LAB_01c96b74:
          iVar19 = 4;
        }
        else {
          while (local_1968 = aVar72, uVar32 != 0) {
            sVar24 = 0;
            for (uVar23 = uVar32; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
              sVar24 = sVar24 + 1;
            }
            uVar32 = uVar32 - 1 & uVar32;
            bVar18 = occluded1(This,bvh,root,sVar24,&pre,ray,&tray,context);
            bVar17 = (byte)(1 << ((uint)sVar24 & 0x1f));
            if (!bVar18) {
              bVar17 = 0;
            }
            local_1a04 = (uint)((byte)local_1a04 | bVar17);
            aVar72 = local_1968;
          }
          iVar19 = 3;
          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar92 = ZEXT1664(auVar33);
          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar93 = ZEXT1664(auVar33);
          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar94 = ZEXT1664(auVar33);
          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar95 = ZEXT1664(auVar33);
          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar96 = ZEXT1664(auVar33);
          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
          auVar97 = ZEXT1664(auVar33);
          auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar91 = ZEXT1664(auVar33);
          auVar85 = ZEXT1664((undefined1  [16])local_1968);
          if ((byte)local_1a04 != 0xf) {
            auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_1a04 & 1) * auVar33._0_4_ |
                 (uint)!(bool)((byte)local_1a04 & 1) * tray.tfar.field_0.i[0];
            bVar18 = (bool)((byte)(local_1a04 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar18 * auVar33._4_4_ | (uint)!bVar18 * tray.tfar.field_0.i[1];
            bVar18 = (bool)((byte)(local_1a04 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar18 * auVar33._8_4_ | (uint)!bVar18 * tray.tfar.field_0.i[2];
            bVar18 = (bool)((byte)(local_1a04 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar18 * auVar33._12_4_ | (uint)!bVar18 * tray.tfar.field_0.i[3];
            iVar19 = 2;
          }
          if (uVar26 < (uint)POPCOUNT(uVar30)) goto LAB_01c969f4;
        }
      } while (iVar19 != 3);
LAB_01c97cba:
      local_1a04._0_1_ = (byte)local_1a04 & (byte)local_196c;
      bVar18 = (bool)((byte)local_1a04 >> 1 & 1);
      bVar7 = (bool)((byte)local_1a04 >> 2 & 1);
      bVar8 = (bool)((byte)local_1a04 >> 3 & 1);
      *(uint *)local_1978 =
           (uint)((byte)local_1a04 & 1) * -0x800000 |
           (uint)!(bool)((byte)local_1a04 & 1) * *(int *)local_1978;
      *(uint *)(local_1978 + 4) =
           (uint)bVar18 * -0x800000 | (uint)!bVar18 * *(int *)(local_1978 + 4);
      *(uint *)(local_1978 + 8) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_1978 + 8);
      *(uint *)(local_1978 + 0xc) =
           (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_1978 + 0xc);
    }
  }
  return;
LAB_01c96bcd:
  do {
    lVar25 = -0x10;
    if (lVar20 == (ulong)((uint)root.ptr & 0xf) - 8) goto LAB_01c97b6a;
    pSVar3 = context->scene;
    bVar29 = bVar17;
    do {
      if ((lVar25 == 0) || (*(int *)(lVar27 + 0x10 + lVar25) == -1)) goto LAB_01c97b4a;
      pfVar4 = (pSVar3->vertices).items[*(uint *)(lVar27 + lVar25)];
      uVar32 = (ulong)*(uint *)(lVar27 + -0x40 + lVar25);
      uVar23 = (ulong)*(uint *)(lVar27 + -0x30 + lVar25);
      fVar84 = pfVar4[uVar32];
      auVar63._4_4_ = fVar84;
      auVar63._0_4_ = fVar84;
      auVar63._8_4_ = fVar84;
      auVar63._12_4_ = fVar84;
      fVar84 = pfVar4[uVar32 + 1];
      auVar64._4_4_ = fVar84;
      auVar64._0_4_ = fVar84;
      auVar64._8_4_ = fVar84;
      auVar64._12_4_ = fVar84;
      fVar84 = pfVar4[uVar32 + 2];
      auVar75._4_4_ = fVar84;
      auVar75._0_4_ = fVar84;
      auVar75._8_4_ = fVar84;
      auVar75._12_4_ = fVar84;
      fVar84 = pfVar4[uVar23];
      auVar89._4_4_ = fVar84;
      auVar89._0_4_ = fVar84;
      auVar89._8_4_ = fVar84;
      auVar89._12_4_ = fVar84;
      fVar84 = pfVar4[uVar23 + 1];
      auVar90._4_4_ = fVar84;
      auVar90._0_4_ = fVar84;
      auVar90._8_4_ = fVar84;
      auVar90._12_4_ = fVar84;
      auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar4[uVar23 + 2]));
      uVar32 = (ulong)*(uint *)(lVar27 + -0x10 + lVar25);
      auVar40 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar4[uVar32]));
      auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar4[uVar32 + 1]));
      auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar4[uVar32 + 2]));
      auVar33 = *(undefined1 (*) [16])ray;
      auVar37 = *(undefined1 (*) [16])(ray + 0x10);
      auVar34 = *(undefined1 (*) [16])(ray + 0x20);
      auVar35 = *(undefined1 (*) [16])(ray + 0x40);
      auVar36 = *(undefined1 (*) [16])(ray + 0x50);
      auVar58 = *(undefined1 (*) [16])(ray + 0x60);
      auVar63 = vsubps_avx(auVar63,auVar33);
      auVar64 = vsubps_avx(auVar64,auVar37);
      auVar75 = vsubps_avx(auVar75,auVar34);
      auVar56 = vsubps_avx(auVar89,auVar33);
      auVar57 = vsubps_avx(auVar90,auVar37);
      auVar43 = vsubps_avx512vl(auVar39,auVar34);
      auVar44 = vsubps_avx512vl(auVar40,auVar33);
      auVar45 = vsubps_avx512vl(auVar41,auVar37);
      auVar46 = vsubps_avx512vl(auVar42,auVar34);
      auVar47 = vsubps_avx512vl(auVar44,auVar63);
      auVar48 = vsubps_avx512vl(auVar45,auVar64);
      auVar49 = vsubps_avx512vl(auVar46,auVar75);
      auVar50 = vsubps_avx512vl(auVar63,auVar56);
      auVar51 = vsubps_avx512vl(auVar64,auVar57);
      auVar52 = vsubps_avx512vl(auVar75,auVar43);
      auVar34 = vaddps_avx512vl(auVar44,auVar63);
      auVar53 = vaddps_avx512vl(auVar45,auVar64);
      auVar33 = vaddps_avx512vl(auVar46,auVar75);
      auVar37._0_4_ = auVar49._0_4_ * auVar53._0_4_;
      auVar37._4_4_ = auVar49._4_4_ * auVar53._4_4_;
      auVar37._8_4_ = auVar49._8_4_ * auVar53._8_4_;
      auVar37._12_4_ = auVar49._12_4_ * auVar53._12_4_;
      auVar37 = vfmsub231ps_fma(auVar37,auVar48,auVar33);
      auVar59._0_4_ = auVar47._0_4_ * auVar33._0_4_;
      auVar59._4_4_ = auVar47._4_4_ * auVar33._4_4_;
      auVar59._8_4_ = auVar47._8_4_ * auVar33._8_4_;
      auVar59._12_4_ = auVar47._12_4_ * auVar33._12_4_;
      auVar33 = vfmsub231ps_fma(auVar59,auVar49,auVar34);
      auVar54._0_4_ = auVar48._0_4_ * auVar34._0_4_;
      auVar54._4_4_ = auVar48._4_4_ * auVar34._4_4_;
      auVar54._8_4_ = auVar48._8_4_ * auVar34._8_4_;
      auVar54._12_4_ = auVar48._12_4_ * auVar34._12_4_;
      auVar34 = vfmsub231ps_fma(auVar54,auVar47,auVar53);
      fVar84 = auVar58._0_4_;
      auVar53._0_4_ = fVar84 * auVar34._0_4_;
      fVar86 = auVar58._4_4_;
      auVar53._4_4_ = fVar86 * auVar34._4_4_;
      fVar87 = auVar58._8_4_;
      auVar53._8_4_ = fVar87 * auVar34._8_4_;
      fVar88 = auVar58._12_4_;
      auVar53._12_4_ = fVar88 * auVar34._12_4_;
      auVar33 = vfmadd231ps_fma(auVar53,auVar36,auVar33);
      auVar33 = vfmadd231ps_fma(auVar33,auVar35,auVar37);
      auVar55._0_4_ = auVar56._0_4_ + auVar63._0_4_;
      auVar55._4_4_ = auVar56._4_4_ + auVar63._4_4_;
      auVar55._8_4_ = auVar56._8_4_ + auVar63._8_4_;
      auVar55._12_4_ = auVar56._12_4_ + auVar63._12_4_;
      auVar60._0_4_ = auVar57._0_4_ + auVar64._0_4_;
      auVar60._4_4_ = auVar57._4_4_ + auVar64._4_4_;
      auVar60._8_4_ = auVar57._8_4_ + auVar64._8_4_;
      auVar60._12_4_ = auVar57._12_4_ + auVar64._12_4_;
      auVar37 = vaddps_avx512vl(auVar75,auVar43);
      auVar34 = vmulps_avx512vl(auVar60,auVar52);
      auVar34 = vfmsub231ps_avx512vl(auVar34,auVar51,auVar37);
      auVar37 = vmulps_avx512vl(auVar37,auVar50);
      auVar37 = vfmsub231ps_avx512vl(auVar37,auVar52,auVar55);
      auVar53 = vmulps_avx512vl(auVar55,auVar51);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar50,auVar60);
      auVar54 = vsubps_avx512vl(auVar56,auVar44);
      auVar61._0_4_ = fVar84 * auVar53._0_4_;
      auVar61._4_4_ = fVar86 * auVar53._4_4_;
      auVar61._8_4_ = fVar87 * auVar53._8_4_;
      auVar61._12_4_ = fVar88 * auVar53._12_4_;
      auVar37 = vfmadd231ps_avx512vl(auVar61,auVar36,auVar37);
      auVar53 = vsubps_avx512vl(auVar57,auVar45);
      auVar37 = vfmadd231ps_fma(auVar37,auVar35,auVar34);
      auVar55 = vsubps_avx512vl(auVar43,auVar46);
      auVar34 = vaddps_avx512vl(auVar56,auVar44);
      auVar56 = vaddps_avx512vl(auVar57,auVar45);
      auVar57 = vaddps_avx512vl(auVar43,auVar46);
      auVar43 = vmulps_avx512vl(auVar56,auVar55);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar53,auVar57);
      auVar57 = vmulps_avx512vl(auVar57,auVar54);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar55,auVar34);
      auVar44._0_4_ = auVar34._0_4_ * auVar53._0_4_;
      auVar44._4_4_ = auVar34._4_4_ * auVar53._4_4_;
      auVar44._8_4_ = auVar34._8_4_ * auVar53._8_4_;
      auVar44._12_4_ = auVar34._12_4_ * auVar53._12_4_;
      auVar34 = vfmsub231ps_fma(auVar44,auVar54,auVar56);
      auVar34 = vmulps_avx512vl(auVar34,auVar58);
      auVar34 = vfmadd231ps_avx512vl(auVar34,auVar36,auVar57);
      auVar34 = vfmadd231ps_avx512vl(auVar34,auVar35,auVar43);
      auVar56._0_4_ = auVar33._0_4_ + auVar37._0_4_;
      auVar56._4_4_ = auVar33._4_4_ + auVar37._4_4_;
      auVar56._8_4_ = auVar33._8_4_ + auVar37._8_4_;
      auVar56._12_4_ = auVar33._12_4_ + auVar37._12_4_;
      auVar58 = vaddps_avx512vl(auVar34,auVar56);
      auVar45 = auVar92._0_16_;
      auVar56 = vandps_avx512vl(auVar58,auVar45);
      auVar57 = vmulps_avx512vl(auVar56,auVar97._0_16_);
      auVar43 = vminps_avx512vl(auVar33,auVar37);
      auVar43 = vminps_avx512vl(auVar43,auVar34);
      auVar44 = vxorps_avx512vl(auVar57,auVar91._0_16_);
      uVar9 = vcmpps_avx512vl(auVar43,auVar44,5);
      local_1968._0_8_ = lVar25;
      uVar32 = (ulong)*(uint *)(lVar27 + -0x20 + lVar25);
      auVar43 = vmaxps_avx512vl(auVar33,auVar37);
      auVar34 = vmaxps_avx512vl(auVar43,auVar34);
      auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar4[uVar32]));
      uVar12 = vcmpps_avx512vl(auVar34,auVar57,2);
      auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar4[uVar32 + 1]));
      auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar4[uVar32 + 2]));
      bVar28 = ((byte)uVar9 | (byte)uVar12) & 0xf & bVar29;
      if (bVar28 != 0) {
        auVar44 = vmulps_avx512vl(auVar51,auVar49);
        auVar46 = vmulps_avx512vl(auVar47,auVar52);
        auVar59 = vmulps_avx512vl(auVar50,auVar48);
        auVar60 = vmulps_avx512vl(auVar53,auVar52);
        auVar61 = vmulps_avx512vl(auVar50,auVar55);
        auVar62 = vmulps_avx512vl(auVar54,auVar51);
        auVar48 = vfmsub213ps_avx512vl(auVar48,auVar52,auVar44);
        auVar49 = vfmsub213ps_avx512vl(auVar49,auVar50,auVar46);
        auVar47 = vfmsub213ps_avx512vl(auVar47,auVar51,auVar59);
        auVar51 = vfmsub213ps_avx512vl(auVar55,auVar51,auVar60);
        auVar52 = vfmsub213ps_avx512vl(auVar54,auVar52,auVar61);
        auVar50 = vfmsub213ps_avx512vl(auVar53,auVar50,auVar62);
        auVar44 = vandps_avx512vl(auVar44,auVar45);
        auVar53 = vandps_avx512vl(auVar60,auVar45);
        uVar32 = vcmpps_avx512vl(auVar44,auVar53,1);
        auVar44 = vandps_avx512vl(auVar46,auVar45);
        auVar46 = vandps_avx512vl(auVar61,auVar45);
        uVar23 = vcmpps_avx512vl(auVar44,auVar46,1);
        auVar44 = vandps_avx512vl(auVar59,auVar45);
        auVar45 = vandps_avx512vl(auVar62,auVar45);
        uVar10 = vcmpps_avx512vl(auVar44,auVar45,1);
        bVar18 = (bool)((byte)uVar32 & 1);
        local_1908._0_4_ = (uint)bVar18 * auVar48._0_4_ | (uint)!bVar18 * auVar51._0_4_;
        bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
        local_1908._4_4_ = (uint)bVar18 * auVar48._4_4_ | (uint)!bVar18 * auVar51._4_4_;
        bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
        local_1908._8_4_ = (uint)bVar18 * auVar48._8_4_ | (uint)!bVar18 * auVar51._8_4_;
        bVar18 = (bool)((byte)(uVar32 >> 3) & 1);
        local_1908._12_4_ = (uint)bVar18 * auVar48._12_4_ | (uint)!bVar18 * auVar51._12_4_;
        bVar18 = (bool)((byte)uVar23 & 1);
        local_1908._16_4_ = (uint)bVar18 * auVar49._0_4_ | (uint)!bVar18 * auVar52._0_4_;
        bVar18 = (bool)((byte)(uVar23 >> 1) & 1);
        local_1908._20_4_ = (uint)bVar18 * auVar49._4_4_ | (uint)!bVar18 * auVar52._4_4_;
        bVar18 = (bool)((byte)(uVar23 >> 2) & 1);
        local_1908._24_4_ = (uint)bVar18 * auVar49._8_4_ | (uint)!bVar18 * auVar52._8_4_;
        bVar18 = (bool)((byte)(uVar23 >> 3) & 1);
        local_1908._28_4_ = (uint)bVar18 * auVar49._12_4_ | (uint)!bVar18 * auVar52._12_4_;
        bVar18 = (bool)((byte)uVar10 & 1);
        local_1908._32_4_ = (float)((uint)bVar18 * auVar47._0_4_ | (uint)!bVar18 * auVar50._0_4_);
        bVar18 = (bool)((byte)(uVar10 >> 1) & 1);
        local_1908._36_4_ = (float)((uint)bVar18 * auVar47._4_4_ | (uint)!bVar18 * auVar50._4_4_);
        bVar18 = (bool)((byte)(uVar10 >> 2) & 1);
        local_1908._40_4_ = (float)((uint)bVar18 * auVar47._8_4_ | (uint)!bVar18 * auVar50._8_4_);
        bVar18 = (bool)((byte)(uVar10 >> 3) & 1);
        local_1908._44_4_ = (float)((uint)bVar18 * auVar47._12_4_ | (uint)!bVar18 * auVar50._12_4_);
        auVar46._0_4_ = fVar84 * local_1908._32_4_;
        auVar46._4_4_ = fVar86 * local_1908._36_4_;
        auVar46._8_4_ = fVar87 * local_1908._40_4_;
        auVar46._12_4_ = fVar88 * local_1908._44_4_;
        auVar36 = vfmadd213ps_fma(auVar36,(undefined1  [16])local_1908.field_0.y.field_0,auVar46);
        auVar35 = vfmadd213ps_fma(auVar35,(undefined1  [16])local_1908.field_0.x.field_0,auVar36);
        auVar45._0_4_ = auVar35._0_4_ + auVar35._0_4_;
        auVar45._4_4_ = auVar35._4_4_ + auVar35._4_4_;
        auVar45._8_4_ = auVar35._8_4_ + auVar35._8_4_;
        auVar45._12_4_ = auVar35._12_4_ + auVar35._12_4_;
        auVar35._0_4_ = auVar75._0_4_ * local_1908._32_4_;
        auVar35._4_4_ = auVar75._4_4_ * local_1908._36_4_;
        auVar35._8_4_ = auVar75._8_4_ * local_1908._40_4_;
        auVar35._12_4_ = auVar75._12_4_ * local_1908._44_4_;
        auVar35 = vfmadd213ps_fma(auVar64,(undefined1  [16])local_1908.field_0.y.field_0,auVar35);
        auVar36 = vfmadd213ps_fma(auVar63,(undefined1  [16])local_1908.field_0.x.field_0,auVar35);
        auVar35 = vrcp14ps_avx512vl(auVar45);
        auVar63 = vxorps_avx512vl(auVar45,auVar91._0_16_);
        auVar75 = auVar93._0_16_;
        auVar64 = vfnmadd213ps_avx512vl(auVar35,auVar45,auVar75);
        auVar35 = vfmadd132ps_fma(auVar64,auVar35,auVar35);
        local_18d8._0_4_ = auVar35._0_4_ * (auVar36._0_4_ + auVar36._0_4_);
        local_18d8._4_4_ = auVar35._4_4_ * (auVar36._4_4_ + auVar36._4_4_);
        local_18d8._8_4_ = auVar35._8_4_ * (auVar36._8_4_ + auVar36._8_4_);
        local_18d8._12_4_ = auVar35._12_4_ * (auVar36._12_4_ + auVar36._12_4_);
        uVar9 = vcmpps_avx512vl(local_18d8,*(undefined1 (*) [16])(ray + 0x80),2);
        uVar12 = vcmpps_avx512vl(local_18d8,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar13 = vcmpps_avx512vl(auVar45,auVar63,4);
        bVar28 = bVar28 & (byte)uVar9 & (byte)uVar12 & (byte)uVar13;
        if (bVar28 != 0) {
          pGVar5 = (context->scene->geometries).items[*(uint *)(lVar27 + lVar25)].ptr;
          uVar1 = pGVar5->mask;
          auVar36._4_4_ = uVar1;
          auVar36._0_4_ = uVar1;
          auVar36._8_4_ = uVar1;
          auVar36._12_4_ = uVar1;
          uVar9 = vptestmd_avx512vl(auVar36,*(undefined1 (*) [16])(ray + 0x90));
          bVar28 = bVar28 & (byte)uVar9 & 0xf;
          uVar32 = (ulong)bVar28;
          if (bVar28 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar47._8_4_ = 0x219392ef;
              auVar47._0_8_ = 0x219392ef219392ef;
              auVar47._12_4_ = 0x219392ef;
              uVar23 = vcmpps_avx512vl(auVar56,auVar47,5);
              auVar35 = vrcp14ps_avx512vl(auVar58);
              auVar36 = vfnmadd213ps_avx512vl(auVar58,auVar35,auVar75);
              auVar35 = vfmadd132ps_avx512vl(auVar36,auVar35,auVar35);
              fVar88 = (float)((uint)((byte)uVar23 & 1) * auVar35._0_4_);
              fVar84 = (float)((uint)((byte)(uVar23 >> 1) & 1) * auVar35._4_4_);
              fVar87 = (float)((uint)((byte)(uVar23 >> 2) & 1) * auVar35._8_4_);
              fVar86 = (float)((uint)((byte)(uVar23 >> 3) & 1) * auVar35._12_4_);
              auVar48._0_4_ = fVar88 * auVar33._0_4_;
              auVar48._4_4_ = fVar84 * auVar33._4_4_;
              auVar48._8_4_ = fVar87 * auVar33._8_4_;
              auVar48._12_4_ = fVar86 * auVar33._12_4_;
              local_18b8 = vminps_avx512vl(auVar48,auVar75);
              auVar33._0_4_ = fVar88 * auVar37._0_4_;
              auVar33._4_4_ = fVar84 * auVar37._4_4_;
              auVar33._8_4_ = fVar87 * auVar37._8_4_;
              auVar33._12_4_ = fVar86 * auVar37._12_4_;
              local_18c8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vminps_avx512vl(auVar33,auVar75);
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)&local_1908.field_0);
              local_18a8 = vpbroadcastd_avx512vl();
              local_18b8 = vpbroadcastd_avx512vl();
              local_18c8 = v.field_0;
              vpcmpeqd_avx2(ZEXT1632(local_18a8),ZEXT1632(local_18a8));
              uStack_1894 = context->user->instID[0];
              local_1898 = uStack_1894;
              uStack_1890 = uStack_1894;
              uStack_188c = uStack_1894;
              uStack_1888 = context->user->instPrimID[0];
              uStack_1884 = uStack_1888;
              uStack_1880 = uStack_1888;
              uStack_187c = uStack_1888;
              auVar33 = *(undefined1 (*) [16])(ray + 0x80);
              auVar37 = vblendmps_avx512vl(auVar33,(undefined1  [16])t.field_0);
              bVar18 = (bool)(bVar28 >> 1 & 1);
              bVar7 = (bool)(bVar28 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar28 & 1) * auVar37._0_4_ | !(bool)(bVar28 & 1) * uStack_1888;
              *(uint *)(ray + 0x84) = (uint)bVar18 * auVar37._4_4_ | !bVar18 * uStack_1888;
              *(uint *)(ray + 0x88) = (uint)bVar7 * auVar37._8_4_ | !bVar7 * uStack_1888;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar28 >> 3) * auVar37._12_4_ | !(bool)(bVar28 >> 3) * uStack_1888;
              local_1988 = vpmovm2d_avx512vl(uVar32);
              args.valid = (int *)local_1988;
              args.geometryUserPtr = pGVar5->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&local_1908;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar5->occlusionFilterN)(&args);
              }
              uVar32 = vptestmd_avx512vl(local_1988,local_1988);
              if ((uVar32 & 0xf) == 0) {
                uVar32 = 0;
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar92 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar93 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar94 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar95 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar96 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar97 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar91 = ZEXT1664(auVar37);
              }
              else {
                p_Var6 = context->args->filter;
                if (p_Var6 == (RTCFilterFunctionN)0x0) {
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar92 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar93 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar94 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar95 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar96 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar97 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar91 = ZEXT1664(auVar37);
                }
                else {
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar92 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar93 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar94 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar95 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar96 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar97 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar91 = ZEXT1664(auVar37);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var6)(&args);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar91 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar97 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar96 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar95 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar94 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar93 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar92 = ZEXT1664(auVar37);
                  }
                }
                uVar32 = vptestmd_avx512vl(local_1988,local_1988);
                uVar32 = uVar32 & 0xf;
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar18 = (bool)((byte)uVar32 & 1);
                auVar49._0_4_ =
                     (uint)bVar18 * auVar37._0_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x80);
                bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar49._4_4_ =
                     (uint)bVar18 * auVar37._4_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x84);
                bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar49._8_4_ =
                     (uint)bVar18 * auVar37._8_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x88);
                bVar18 = SUB81(uVar32 >> 3,0);
                auVar49._12_4_ =
                     (uint)bVar18 * auVar37._12_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar49;
              }
              bVar18 = (bool)((byte)uVar32 & 1);
              auVar50._0_4_ = (uint)bVar18 * *(int *)local_1978 | (uint)!bVar18 * auVar33._0_4_;
              bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar50._4_4_ =
                   (uint)bVar18 * *(int *)(local_1978 + 4) | (uint)!bVar18 * auVar33._4_4_;
              bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar50._8_4_ =
                   (uint)bVar18 * *(int *)(local_1978 + 8) | (uint)!bVar18 * auVar33._8_4_;
              bVar18 = SUB81(uVar32 >> 3,0);
              auVar50._12_4_ =
                   (uint)bVar18 * *(int *)(local_1978 + 0xc) | (uint)!bVar18 * auVar33._12_4_;
              *(undefined1 (*) [16])local_1978 = auVar50;
            }
            bVar29 = ((byte)uVar32 ^ 0xf) & bVar29;
          }
        }
      }
      if (bVar29 == 0) break;
      auVar33 = *(undefined1 (*) [16])ray;
      auVar37 = *(undefined1 (*) [16])(ray + 0x10);
      auVar35 = *(undefined1 (*) [16])(ray + 0x20);
      auVar36 = *(undefined1 (*) [16])(ray + 0x40);
      auVar58 = *(undefined1 (*) [16])(ray + 0x50);
      auVar63 = *(undefined1 (*) [16])(ray + 0x60);
      auVar64 = vsubps_avx(auVar43,auVar33);
      auVar34 = vsubps_avx(auVar34,auVar37);
      auVar75 = vsubps_avx(auVar57,auVar35);
      auVar56 = vsubps_avx(auVar40,auVar33);
      auVar57 = vsubps_avx(auVar41,auVar37);
      auVar40 = vsubps_avx512vl(auVar42,auVar35);
      auVar41 = vsubps_avx512vl(auVar89,auVar33);
      auVar37 = vsubps_avx512vl(auVar90,auVar37);
      auVar35 = vsubps_avx512vl(auVar39,auVar35);
      auVar39 = vsubps_avx512vl(auVar41,auVar64);
      auVar42 = vsubps_avx512vl(auVar37,auVar34);
      auVar43 = vsubps_avx512vl(auVar35,auVar75);
      auVar44 = vsubps_avx512vl(auVar64,auVar56);
      auVar45 = vsubps_avx512vl(auVar34,auVar57);
      auVar46 = vsubps_avx512vl(auVar75,auVar40);
      auVar47 = vsubps_avx512vl(auVar56,auVar41);
      auVar48 = vsubps_avx512vl(auVar57,auVar37);
      auVar49 = vsubps_avx512vl(auVar40,auVar35);
      auVar33 = vaddps_avx512vl(auVar41,auVar64);
      auVar50 = vaddps_avx512vl(auVar37,auVar34);
      auVar51 = vaddps_avx512vl(auVar35,auVar75);
      auVar52 = vmulps_avx512vl(auVar50,auVar43);
      auVar52 = vfmsub231ps_avx512vl(auVar52,auVar42,auVar51);
      auVar51 = vmulps_avx512vl(auVar51,auVar39);
      auVar51 = vfmsub231ps_avx512vl(auVar51,auVar43,auVar33);
      auVar62._0_4_ = auVar42._0_4_ * auVar33._0_4_;
      auVar62._4_4_ = auVar42._4_4_ * auVar33._4_4_;
      auVar62._8_4_ = auVar42._8_4_ * auVar33._8_4_;
      auVar62._12_4_ = auVar42._12_4_ * auVar33._12_4_;
      auVar33 = vfmsub231ps_fma(auVar62,auVar39,auVar50);
      fVar84 = auVar63._0_4_;
      auVar77._0_4_ = fVar84 * auVar33._0_4_;
      fVar86 = auVar63._4_4_;
      auVar77._4_4_ = fVar86 * auVar33._4_4_;
      fVar87 = auVar63._8_4_;
      auVar77._8_4_ = fVar87 * auVar33._8_4_;
      fVar88 = auVar63._12_4_;
      auVar77._12_4_ = fVar88 * auVar33._12_4_;
      auVar33 = vfmadd231ps_avx512vl(auVar77,auVar58,auVar51);
      auVar50 = vfmadd231ps_avx512vl(auVar33,auVar36,auVar52);
      auVar78._0_4_ = auVar56._0_4_ + auVar64._0_4_;
      auVar78._4_4_ = auVar56._4_4_ + auVar64._4_4_;
      auVar78._8_4_ = auVar56._8_4_ + auVar64._8_4_;
      auVar78._12_4_ = auVar56._12_4_ + auVar64._12_4_;
      auVar33 = vaddps_avx512vl(auVar34,auVar57);
      auVar51 = vaddps_avx512vl(auVar75,auVar40);
      auVar52 = vmulps_avx512vl(auVar33,auVar46);
      auVar52 = vfmsub231ps_avx512vl(auVar52,auVar45,auVar51);
      auVar51 = vmulps_avx512vl(auVar51,auVar44);
      auVar51 = vfmsub231ps_avx512vl(auVar51,auVar46,auVar78);
      auVar53 = vmulps_avx512vl(auVar78,auVar45);
      auVar33 = vfmsub231ps_avx512vl(auVar53,auVar44,auVar33);
      auVar79._0_4_ = fVar84 * auVar33._0_4_;
      auVar79._4_4_ = fVar86 * auVar33._4_4_;
      auVar79._8_4_ = fVar87 * auVar33._8_4_;
      auVar79._12_4_ = fVar88 * auVar33._12_4_;
      auVar33 = vfmadd231ps_avx512vl(auVar79,auVar58,auVar51);
      auVar51 = vfmadd231ps_avx512vl(auVar33,auVar36,auVar52);
      auVar52 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar91 = ZEXT1664(auVar52);
      auVar33 = vaddps_avx512vl(auVar56,auVar41);
      auVar37 = vaddps_avx512vl(auVar57,auVar37);
      auVar35 = vaddps_avx512vl(auVar40,auVar35);
      auVar56 = vmulps_avx512vl(auVar37,auVar49);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar48,auVar35);
      auVar35 = vmulps_avx512vl(auVar35,auVar47);
      auVar35 = vfmsub231ps_avx512vl(auVar35,auVar49,auVar33);
      auVar57._0_4_ = auVar33._0_4_ * auVar48._0_4_;
      auVar57._4_4_ = auVar33._4_4_ * auVar48._4_4_;
      auVar57._8_4_ = auVar33._8_4_ * auVar48._8_4_;
      auVar57._12_4_ = auVar33._12_4_ * auVar48._12_4_;
      auVar33 = vfmsub231ps_fma(auVar57,auVar47,auVar37);
      auVar33 = vmulps_avx512vl(auVar33,auVar63);
      auVar33 = vfmadd231ps_avx512vl(auVar33,auVar58,auVar35);
      auVar33 = vfmadd231ps_avx512vl(auVar33,auVar36,auVar56);
      auVar40._0_4_ = auVar50._0_4_ + auVar51._0_4_;
      auVar40._4_4_ = auVar50._4_4_ + auVar51._4_4_;
      auVar40._8_4_ = auVar50._8_4_ + auVar51._8_4_;
      auVar40._12_4_ = auVar50._12_4_ + auVar51._12_4_;
      auVar37 = vaddps_avx512vl(auVar33,auVar40);
      auVar40 = auVar92._0_16_;
      auVar35 = vandps_avx512vl(auVar37,auVar40);
      auVar63 = vmulps_avx512vl(auVar35,auVar97._0_16_);
      auVar56 = vminps_avx512vl(auVar50,auVar51);
      auVar56 = vminps_avx512vl(auVar56,auVar33);
      auVar57 = vxorps_avx512vl(auVar63,auVar52);
      uVar9 = vcmpps_avx512vl(auVar56,auVar57,5);
      auVar56 = vmaxps_avx512vl(auVar50,auVar51);
      auVar33 = vmaxps_avx512vl(auVar56,auVar33);
      uVar12 = vcmpps_avx512vl(auVar33,auVar63,2);
      bVar28 = ((byte)uVar9 | (byte)uVar12) & 0xf & bVar29;
      if (bVar28 != 0) {
        auVar33 = vmulps_avx512vl(auVar45,auVar43);
        auVar63 = vmulps_avx512vl(auVar39,auVar46);
        auVar56 = vmulps_avx512vl(auVar44,auVar42);
        auVar57 = vmulps_avx512vl(auVar48,auVar46);
        auVar41 = vmulps_avx512vl(auVar44,auVar49);
        auVar53 = vmulps_avx512vl(auVar47,auVar45);
        auVar42 = vfmsub213ps_avx512vl(auVar42,auVar46,auVar33);
        auVar43 = vfmsub213ps_avx512vl(auVar43,auVar44,auVar63);
        auVar39 = vfmsub213ps_avx512vl(auVar39,auVar45,auVar56);
        auVar45 = vfmsub213ps_avx512vl(auVar49,auVar45,auVar57);
        auVar46 = vfmsub213ps_avx512vl(auVar47,auVar46,auVar41);
        auVar44 = vfmsub213ps_avx512vl(auVar48,auVar44,auVar53);
        auVar33 = vandps_avx512vl(auVar33,auVar40);
        auVar57 = vandps_avx512vl(auVar57,auVar40);
        uVar32 = vcmpps_avx512vl(auVar33,auVar57,1);
        auVar33 = vandps_avx512vl(auVar63,auVar40);
        auVar63 = vandps_avx512vl(auVar41,auVar40);
        uVar23 = vcmpps_avx512vl(auVar33,auVar63,1);
        auVar33 = vandps_avx512vl(auVar56,auVar40);
        auVar63 = vandps_avx512vl(auVar53,auVar40);
        uVar10 = vcmpps_avx512vl(auVar33,auVar63,1);
        bVar18 = (bool)((byte)uVar32 & 1);
        local_1908._0_4_ = (uint)bVar18 * auVar42._0_4_ | (uint)!bVar18 * auVar45._0_4_;
        bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
        local_1908._4_4_ = (uint)bVar18 * auVar42._4_4_ | (uint)!bVar18 * auVar45._4_4_;
        bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
        local_1908._8_4_ = (uint)bVar18 * auVar42._8_4_ | (uint)!bVar18 * auVar45._8_4_;
        bVar18 = (bool)((byte)(uVar32 >> 3) & 1);
        local_1908._12_4_ = (uint)bVar18 * auVar42._12_4_ | (uint)!bVar18 * auVar45._12_4_;
        bVar18 = (bool)((byte)uVar23 & 1);
        local_1908._16_4_ = (uint)bVar18 * auVar43._0_4_ | (uint)!bVar18 * auVar46._0_4_;
        bVar18 = (bool)((byte)(uVar23 >> 1) & 1);
        local_1908._20_4_ = (uint)bVar18 * auVar43._4_4_ | (uint)!bVar18 * auVar46._4_4_;
        bVar18 = (bool)((byte)(uVar23 >> 2) & 1);
        local_1908._24_4_ = (uint)bVar18 * auVar43._8_4_ | (uint)!bVar18 * auVar46._8_4_;
        bVar18 = (bool)((byte)(uVar23 >> 3) & 1);
        local_1908._28_4_ = (uint)bVar18 * auVar43._12_4_ | (uint)!bVar18 * auVar46._12_4_;
        bVar18 = (bool)((byte)uVar10 & 1);
        local_1908._32_4_ = (float)((uint)bVar18 * auVar39._0_4_ | (uint)!bVar18 * auVar44._0_4_);
        bVar18 = (bool)((byte)(uVar10 >> 1) & 1);
        local_1908._36_4_ = (float)((uint)bVar18 * auVar39._4_4_ | (uint)!bVar18 * auVar44._4_4_);
        bVar18 = (bool)((byte)(uVar10 >> 2) & 1);
        local_1908._40_4_ = (float)((uint)bVar18 * auVar39._8_4_ | (uint)!bVar18 * auVar44._8_4_);
        bVar18 = (bool)((byte)(uVar10 >> 3) & 1);
        local_1908._44_4_ = (float)((uint)bVar18 * auVar39._12_4_ | (uint)!bVar18 * auVar44._12_4_);
        auVar42._0_4_ = fVar84 * local_1908._32_4_;
        auVar42._4_4_ = fVar86 * local_1908._36_4_;
        auVar42._8_4_ = fVar87 * local_1908._40_4_;
        auVar42._12_4_ = fVar88 * local_1908._44_4_;
        auVar33 = vfmadd213ps_fma(auVar58,(undefined1  [16])local_1908.field_0.y.field_0,auVar42);
        auVar33 = vfmadd213ps_fma(auVar36,(undefined1  [16])local_1908.field_0.x.field_0,auVar33);
        auVar39._0_4_ = auVar33._0_4_ + auVar33._0_4_;
        auVar39._4_4_ = auVar33._4_4_ + auVar33._4_4_;
        auVar39._8_4_ = auVar33._8_4_ + auVar33._8_4_;
        auVar39._12_4_ = auVar33._12_4_ + auVar33._12_4_;
        auVar41._0_4_ = auVar75._0_4_ * local_1908._32_4_;
        auVar41._4_4_ = auVar75._4_4_ * local_1908._36_4_;
        auVar41._8_4_ = auVar75._8_4_ * local_1908._40_4_;
        auVar41._12_4_ = auVar75._12_4_ * local_1908._44_4_;
        auVar33 = vfmadd213ps_fma(auVar34,(undefined1  [16])local_1908.field_0.y.field_0,auVar41);
        auVar34 = vfmadd213ps_fma(auVar64,(undefined1  [16])local_1908.field_0.x.field_0,auVar33);
        auVar33 = vrcp14ps_avx512vl(auVar39);
        auVar36 = vxorps_avx512vl(auVar39,auVar52);
        auVar63 = auVar93._0_16_;
        auVar58 = vfnmadd213ps_avx512vl(auVar33,auVar39,auVar63);
        auVar33 = vfmadd132ps_fma(auVar58,auVar33,auVar33);
        local_18d8._0_4_ = auVar33._0_4_ * (auVar34._0_4_ + auVar34._0_4_);
        local_18d8._4_4_ = auVar33._4_4_ * (auVar34._4_4_ + auVar34._4_4_);
        local_18d8._8_4_ = auVar33._8_4_ * (auVar34._8_4_ + auVar34._8_4_);
        local_18d8._12_4_ = auVar33._12_4_ * (auVar34._12_4_ + auVar34._12_4_);
        uVar9 = vcmpps_avx512vl(local_18d8,*(undefined1 (*) [16])(ray + 0x80),2);
        uVar12 = vcmpps_avx512vl(local_18d8,*(undefined1 (*) [16])(ray + 0x30),0xd);
        uVar13 = vcmpps_avx512vl(auVar39,auVar36,4);
        bVar28 = bVar28 & (byte)uVar9 & (byte)uVar12 & (byte)uVar13;
        if (bVar28 != 0) {
          pGVar5 = (context->scene->geometries).items[*(uint *)(lVar27 + local_1968._0_8_)].ptr;
          uVar1 = pGVar5->mask;
          auVar34._4_4_ = uVar1;
          auVar34._0_4_ = uVar1;
          auVar34._8_4_ = uVar1;
          auVar34._12_4_ = uVar1;
          uVar9 = vptestmd_avx512vl(auVar34,*(undefined1 (*) [16])(ray + 0x90));
          bVar28 = bVar28 & (byte)uVar9 & 0xf;
          uVar32 = (ulong)bVar28;
          if (bVar28 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar43._8_4_ = 0x219392ef;
              auVar43._0_8_ = 0x219392ef219392ef;
              auVar43._12_4_ = 0x219392ef;
              uVar23 = vcmpps_avx512vl(auVar35,auVar43,5);
              auVar33 = vrcp14ps_avx512vl(auVar37);
              auVar37 = vfnmadd213ps_avx512vl(auVar37,auVar33,auVar63);
              auVar33 = vfmadd132ps_avx512vl(auVar37,auVar33,auVar33);
              fVar88 = (float)((uint)((byte)uVar23 & 1) * auVar33._0_4_);
              fVar87 = (float)((uint)((byte)(uVar23 >> 1) & 1) * auVar33._4_4_);
              fVar86 = (float)((uint)((byte)(uVar23 >> 2) & 1) * auVar33._8_4_);
              fVar84 = (float)((uint)((byte)(uVar23 >> 3) & 1) * auVar33._12_4_);
              auVar52._0_4_ = fVar88 * auVar50._0_4_;
              auVar52._4_4_ = fVar87 * auVar50._4_4_;
              auVar52._8_4_ = fVar86 * auVar50._8_4_;
              auVar52._12_4_ = fVar84 * auVar50._12_4_;
              auVar33 = vminps_avx512vl(auVar52,auVar63);
              auVar80._0_4_ = fVar88 * auVar51._0_4_;
              auVar80._4_4_ = fVar87 * auVar51._4_4_;
              auVar80._8_4_ = fVar86 * auVar51._8_4_;
              auVar80._12_4_ = fVar84 * auVar51._12_4_;
              auVar37 = vminps_avx512vl(auVar80,auVar63);
              local_18b8 = vsubps_avx512vl(auVar63,auVar33);
              local_18c8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           vsubps_avx512vl(auVar63,auVar37);
              args.valid = (int *)&Ng;
              args.geometryUserPtr = &t;
              args.context = (RTCRayQueryContext *)&v;
              args.ray = (RTCRayN *)&u;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                   *)&local_1908.field_0);
              local_18a8 = vpbroadcastd_avx512vl();
              local_18b8 = vpbroadcastd_avx512vl();
              local_18c8 = v.field_0;
              vpcmpeqd_avx2(ZEXT1632(local_18a8),ZEXT1632(local_18a8));
              uStack_1894 = context->user->instID[0];
              local_1898 = uStack_1894;
              uStack_1890 = uStack_1894;
              uStack_188c = uStack_1894;
              uStack_1888 = context->user->instPrimID[0];
              uStack_1884 = uStack_1888;
              uStack_1880 = uStack_1888;
              uStack_187c = uStack_1888;
              auVar33 = *(undefined1 (*) [16])(ray + 0x80);
              auVar37 = vblendmps_avx512vl(auVar33,(undefined1  [16])t.field_0);
              bVar18 = (bool)(bVar28 >> 1 & 1);
              bVar7 = (bool)(bVar28 >> 2 & 1);
              *(uint *)(ray + 0x80) =
                   (uint)(bVar28 & 1) * auVar37._0_4_ | !(bool)(bVar28 & 1) * uStack_1888;
              *(uint *)(ray + 0x84) = (uint)bVar18 * auVar37._4_4_ | !bVar18 * uStack_1888;
              *(uint *)(ray + 0x88) = (uint)bVar7 * auVar37._8_4_ | !bVar7 * uStack_1888;
              *(uint *)(ray + 0x8c) =
                   (uint)(bVar28 >> 3) * auVar37._12_4_ | !(bool)(bVar28 >> 3) * uStack_1888;
              local_1988 = vpmovm2d_avx512vl(uVar32);
              args.valid = (int *)local_1988;
              args.geometryUserPtr = pGVar5->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&local_1908;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar5->occlusionFilterN)(&args);
              }
              uVar32 = vptestmd_avx512vl(local_1988,local_1988);
              if ((uVar32 & 0xf) == 0) {
                uVar32 = 0;
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar92 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar93 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar94 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar95 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar96 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar97 = ZEXT1664(auVar37);
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar91 = ZEXT1664(auVar37);
              }
              else {
                p_Var6 = context->args->filter;
                if (p_Var6 == (RTCFilterFunctionN)0x0) {
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar92 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar93 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar94 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar95 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar96 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar97 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar91 = ZEXT1664(auVar37);
                }
                else {
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar92 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar93 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar94 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar95 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar96 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar97 = ZEXT1664(auVar37);
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar91 = ZEXT1664(auVar37);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var6)(&args);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar91 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar97 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar96 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar95 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar94 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar93 = ZEXT1664(auVar37);
                    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar92 = ZEXT1664(auVar37);
                  }
                }
                uVar32 = vptestmd_avx512vl(local_1988,local_1988);
                uVar32 = uVar32 & 0xf;
                auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar18 = (bool)((byte)uVar32 & 1);
                auVar51._0_4_ =
                     (uint)bVar18 * auVar37._0_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x80);
                bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
                auVar51._4_4_ =
                     (uint)bVar18 * auVar37._4_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x84);
                bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
                auVar51._8_4_ =
                     (uint)bVar18 * auVar37._8_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x88);
                bVar18 = SUB81(uVar32 >> 3,0);
                auVar51._12_4_ =
                     (uint)bVar18 * auVar37._12_4_ | (uint)!bVar18 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar51;
              }
              bVar18 = (bool)((byte)uVar32 & 1);
              auVar65._0_4_ = (uint)bVar18 * *(int *)local_1978 | (uint)!bVar18 * auVar33._0_4_;
              bVar18 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar65._4_4_ =
                   (uint)bVar18 * *(int *)(local_1978 + 4) | (uint)!bVar18 * auVar33._4_4_;
              bVar18 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar65._8_4_ =
                   (uint)bVar18 * *(int *)(local_1978 + 8) | (uint)!bVar18 * auVar33._8_4_;
              bVar18 = SUB81(uVar32 >> 3,0);
              auVar65._12_4_ =
                   (uint)bVar18 * *(int *)(local_1978 + 0xc) | (uint)!bVar18 * auVar33._12_4_;
              *(undefined1 (*) [16])local_1978 = auVar65;
            }
            bVar29 = ((byte)uVar32 ^ 0xf) & bVar29;
          }
        }
      }
      lVar25 = local_1968._0_8_ + 4;
    } while (bVar29 != 0);
    bVar29 = 0;
LAB_01c97b4a:
    lVar20 = lVar20 + 1;
    lVar27 = lVar27 + 0x60;
    bVar17 = bVar17 & bVar29;
  } while (bVar17 != 0);
  bVar17 = 0;
LAB_01c97b6a:
  bVar17 = (byte)local_1a04 | ~bVar17 & 0xf;
  local_1a04 = (uint)bVar17;
  if (bVar17 == 0xf) {
    local_1a04._0_1_ = 0xf;
    goto LAB_01c97cba;
  }
  auVar33 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar18 = (bool)(bVar17 >> 1 & 1);
  bVar7 = (bool)(bVar17 >> 2 & 1);
  bVar8 = (bool)(bVar17 >> 3 & 1);
  tray.tfar.field_0.i[1] = (uint)bVar18 * auVar33._4_4_ | (uint)!bVar18 * tray.tfar.field_0.i[1];
  tray.tfar.field_0.i[0] =
       (uint)(bVar17 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar17 & 1) * tray.tfar.field_0.i[0];
  tray.tfar.field_0.i[2] = (uint)bVar7 * auVar33._8_4_ | (uint)!bVar7 * tray.tfar.field_0.i[2];
  tray.tfar.field_0.i[3] = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * tray.tfar.field_0.i[3];
  goto LAB_01c969ac;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }